

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

Vec_Int_t * Fra_OneHotCompute(Fra_Man_t *p,Fra_Sml_t *pSim)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  uint uVar9;
  uint uVar10;
  uint Entry;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Aig_Man_t *pAVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  pAVar15 = pSim->pAig;
  if (pAVar15 != p->pManAig) {
    __assert_fail("pSim->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                  ,0x8d,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
  }
  uVar17 = pAVar15->nObjs[2] - pAVar15->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  pVVar8 = pAVar15->vCis;
  iVar5 = pVVar8->nSize;
  if ((int)uVar17 < iVar5) {
    uVar16 = (ulong)uVar17;
    uVar10 = uVar17;
    do {
      uVar10 = uVar10 + 1;
      if ((int)uVar17 < 0) {
LAB_00920c54:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = pSim->nWordsTotal;
      iVar2 = pSim->nWordsPref;
      if (iVar2 < iVar1) {
        pvVar3 = pVVar8->pArray[uVar16];
        lVar11 = 0;
        do {
          if (*(int *)((long)&pSim[1].pAig +
                      lVar11 * 4 +
                      (long)(*(int *)((long)pvVar3 + 0x24) * iVar1) * 4 + (long)iVar2 * 4) != 0) {
            uVar9 = (int)uVar16 - uVar17;
            if ((int)uVar9 < 0) {
              __assert_fail("i-nTruePis >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                            ,0x93,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
            }
            if ((int)uVar16 + 1 < iVar5) {
              uVar4 = (ulong)uVar10;
              uVar18 = uVar16;
              goto LAB_00920aee;
            }
            break;
          }
          lVar11 = lVar11 + 1;
        } while (iVar1 - iVar2 != (int)lVar11);
      }
LAB_00920c2c:
      uVar16 = uVar16 + 1;
      pVVar8 = pAVar15->vCis;
      iVar5 = pVVar8->nSize;
    } while ((int)uVar16 < iVar5);
  }
  return p_00;
LAB_00920aee:
  uVar7 = uVar4;
  if (-2 < (int)uVar18) {
    iVar5 = pSim->nWordsTotal;
    iVar1 = pSim->nWordsPref;
    if (iVar1 < iVar5) {
      lVar11 = (long)(*(int *)((long)pVVar8->pArray[uVar7] + 0x24) * iVar5) * 4 + (long)iVar1 * 4;
      lVar12 = 0;
      do {
        if (*(int *)((long)&pSim[1].pAig + lVar12 * 4 + lVar11) != 0) {
          lVar12 = (long)*(int *)((long)pvVar3 + 0x24) * (long)iVar5 * 4 + (long)iVar1 * 4;
          lVar13 = 0;
          goto LAB_00920b65;
        }
        lVar12 = lVar12 + 1;
      } while (iVar5 - iVar1 != (int)lVar12);
    }
    goto LAB_00920bec;
  }
  goto LAB_00920c54;
  while (lVar13 = lVar13 + 1, iVar5 - iVar1 != (int)lVar13) {
LAB_00920b65:
    if (*(int *)((long)&pSim[1].pAig + lVar13 * 4 + lVar12) !=
        *(int *)((long)&pSim[1].pAig + lVar13 * 4 + lVar11)) {
      uVar14 = (int)uVar7 - uVar17;
      if ((int)uVar14 < 0) {
        __assert_fail("k-nTruePis >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraHot.c"
                      ,0x9c,"Vec_Int_t *Fra_OneHotCompute(Fra_Man_t *, Fra_Sml_t *)");
      }
      lVar13 = 0;
      goto LAB_00920b8e;
    }
  }
  goto LAB_00920bec;
  while (lVar13 = lVar13 + 1, Entry = ~uVar9, iVar5 - iVar1 != (int)lVar13) {
LAB_00920b8e:
    if ((*(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar12) &
        *(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar11)) != 0) {
      lVar13 = 0;
      goto LAB_00920baf;
    }
  }
  goto LAB_00920bc9;
  while (lVar13 = lVar13 + 1, Entry = uVar9 + 1, iVar5 - iVar1 != (int)lVar13) {
LAB_00920baf:
    if ((*(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar11) &
        ~*(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar12)) != 0) {
      lVar13 = 0;
      goto LAB_00920c07;
    }
  }
LAB_00920bc9:
  Vec_IntPush(p_00,Entry);
  uVar14 = ~uVar14;
LAB_00920bd4:
  Vec_IntPush(p_00,uVar14);
LAB_00920bec:
  pAVar15 = pSim->pAig;
  pVVar8 = pAVar15->vCis;
  uVar4 = uVar7 + 1;
  uVar18 = uVar7;
  if (pVVar8->nSize <= (int)(uVar7 + 1)) goto LAB_00920c2c;
  goto LAB_00920aee;
  while (lVar13 = lVar13 + 1, iVar5 - iVar1 != (int)lVar13) {
LAB_00920c07:
    if ((*(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar12) &
        ~*(uint *)((long)&pSim[1].pAig + lVar13 * 4 + lVar11)) != 0) goto LAB_00920bec;
  }
  Vec_IntPush(p_00,~uVar9);
  uVar14 = uVar14 + 1;
  goto LAB_00920bd4;
}

Assistant:

Vec_Int_t * Fra_OneHotCompute( Fra_Man_t * p, Fra_Sml_t * pSim )
{
    int fSkipConstEqu = 1;
    Vec_Int_t * vOneHots;
    Aig_Obj_t * pObj1, * pObj2;
    int i, k;
    int nTruePis = Aig_ManCiNum(pSim->pAig) - Aig_ManRegNum(pSim->pAig);
    assert( pSim->pAig == p->pManAig );
    vOneHots = Vec_IntAlloc( 100 );
    Aig_ManForEachLoSeq( pSim->pAig, pObj1, i )
    {
        if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj1) )
            continue;
        assert( i-nTruePis >= 0 );
//        Aig_ManForEachLoSeq( pSim->pAig, pObj2, k )
//        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vPis, pObj2, k, Aig_ManCiNum(p)-Aig_ManRegNum(p) )
        Vec_PtrForEachEntryStart( Aig_Obj_t *, pSim->pAig->vCis, pObj2, k, i+1 )
        {
            if ( fSkipConstEqu && Fra_OneHotNodeIsConst(pSim, pObj2) )
                continue;
            if ( fSkipConstEqu && Fra_OneHotNodesAreEqual( pSim, pObj1, pObj2 ) )
                continue;
            assert( k-nTruePis >= 0 );
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 0, 1 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 0) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 1) );
                continue;
            }
            if ( Fra_OneHotNodesAreClause( pSim, pObj1, pObj2, 1, 0 ) )
            {
                Vec_IntPush( vOneHots, Fra_RegToLit(i-nTruePis, 1) );
                Vec_IntPush( vOneHots, Fra_RegToLit(k-nTruePis, 0) );
                continue;
            }
        }
    }
    return vOneHots;
}